

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

SymbolListCItr __thiscall
Jinx::Impl::Parser::GetNextSymbolOfType(Parser *this,SymbolType type,SymbolListCItr endSymbol)

{
  Symbol *pSVar1;
  
  pSVar1 = (this->m_currentSymbol)._M_current;
  if (pSVar1 != endSymbol._M_current) {
    do {
      if (pSVar1 == (this->m_symbolList->
                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                    _M_impl.super__Vector_impl_data._M_finish) {
        return (SymbolListCItr)endSymbol._M_current;
      }
      if (pSVar1->type == type) {
        return (SymbolListCItr)pSVar1;
      }
      pSVar1 = pSVar1 + 1;
    } while (pSVar1 != endSymbol._M_current);
  }
  return (SymbolListCItr)endSymbol._M_current;
}

Assistant:

inline_t SymbolListCItr Parser::GetNextSymbolOfType(SymbolType type, SymbolListCItr endSymbol) const
	{
		auto curr = m_currentSymbol;
		while (curr != endSymbol && curr != m_symbolList.end())
		{
			if (curr->type == type)
			{
				endSymbol = curr;
				break;
			}
			++curr;
		}
		return endSymbol;
	}